

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

void __thiscall String::append(String *this,String *ba)

{
  string local_38;
  String *local_18;
  String *ba_local;
  String *this_local;
  
  local_18 = ba;
  ba_local = this;
  operator_cast_to_string(&local_38,ba);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void append(const String &ba)
    {
        mString.append(ba);
    }